

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O2

Instr * __thiscall Lowerer::LowerBailOnEarlyExit(Lowerer *this,Instr *instr)

{
  Instr *pIVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  
  if ((instr->field_0x38 & 0x10) == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x32f2,"(instr->HasBailOutInfo())","instr->HasBailOutInfo()");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  pIVar1 = instr->m_prev;
  GenerateBailOut(this,instr,(BranchInstr *)0x0,(LabelInstr *)0x0,(LabelInstr *)0x0);
  return pIVar1;
}

Assistant:

IR::Instr*
Lowerer::LowerBailOnEarlyExit(IR::Instr * instr)
{
    Assert(instr->HasBailOutInfo());
    IR::Instr * instrPrev = instr->m_prev;

    this->GenerateBailOut(instr, nullptr, nullptr);

    return instrPrev;
}